

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O2

Error asmjit::VirtMem::alloc(void **p,size_t size,uint32_t flags)

{
  int __prot;
  void *pvVar1;
  Error EVar2;
  
  *p = (void *)0x0;
  if (size == 0) {
    EVar2 = 2;
  }
  else {
    __prot = VirtMem_mmProtFromFlags(flags);
    EVar2 = 0;
    pvVar1 = mmap((void *)0x0,size,__prot,0x22,-1,0);
    if (pvVar1 == (void *)0xffffffffffffffff) {
      EVar2 = 1;
    }
    else {
      *p = pvVar1;
    }
  }
  return EVar2;
}

Assistant:

Error VirtMem::alloc(void** p, size_t size, uint32_t flags) noexcept {
  *p = nullptr;
  if (size == 0)
    return DebugUtils::errored(kErrorInvalidArgument);

  int protection = VirtMem_mmProtFromFlags(flags) | VirtMem_mmMaxProtFromFlags(flags);
  int mmFlags = MAP_PRIVATE | MAP_ANONYMOUS | VirtMem_mmMapJitFromFlags(flags);

  void* ptr = mmap(nullptr, size, protection, mmFlags, -1, 0);
  if (ptr == MAP_FAILED)
    return DebugUtils::errored(kErrorOutOfMemory);

  *p = ptr;
  return kErrorOk;
}